

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

void gflags::HandleCommandLineHelpFlags(void)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uVar6;
  pointer pCVar7;
  string package;
  string r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substrings;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags_1;
  
  pcVar3 = ProgramInvocationShortName();
  HandleCommandLineCompletions();
  substrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  substrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  substrings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&r,"",(allocator<char> *)&package);
  std::__cxx11::string::push_back((char)&r);
  std::__cxx11::string::append((char *)&r);
  std::operator+(&package,&r,".");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&substrings,
             &package);
  std::__cxx11::string::~string((string *)&package);
  std::operator+(&package,&r,"-main.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&substrings,
             &package);
  std::__cxx11::string::~string((string *)&package);
  std::operator+(&package,&r,"_main.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&substrings,
             &package);
  std::__cxx11::string::~string((string *)&package);
  std::__cxx11::string::~string((string *)&r);
  if (fLB::FLAGS_helpshort == '\x01') {
    ShowUsageWithFlagsMatching(pcVar3,&substrings);
  }
  else if ((fLB::FLAGS_help == '\0') && (fLB::FLAGS_helpfull != '\x01')) {
    if (fLS::FLAGS_helpon_abi_cxx11_->_M_string_length != 0) {
      std::operator+(&package,'/',fLS::FLAGS_helpon_abi_cxx11_);
      std::operator+(&r,&package,".");
      std::__cxx11::string::~string((string *)&package);
      ShowUsageWithFlagsRestrict(pcVar3,r._M_dataplus._M_p);
      (*(code *)gflags_exitfunc)(1);
      return;
    }
    if (fLS::FLAGS_helpmatch_abi_cxx11_[1] == 0) {
      if (fLB::FLAGS_helppackage == '\x01') {
        flags.
        super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        flags.
        super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        flags.
        super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetAllFlags(&flags);
        r._M_dataplus._M_p = (pointer)&r.field_2;
        r._M_string_length = 0;
        r.field_2._M_local_buf[0] = '\0';
        for (pCVar7 = flags.
                      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar7 != flags.
                      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pCVar7 = pCVar7 + 1) {
          bVar2 = FileMatchesSubstring(&pCVar7->filename,&substrings);
          if (bVar2) {
            Dirname((string *)&flags_1,&pCVar7->filename);
            std::operator+(&package,(string *)&flags_1,'/');
            std::__cxx11::string::~string((string *)&flags_1);
            bVar2 = std::operator!=(&package,&r);
            if (bVar2) {
              ShowUsageWithFlagsRestrict(pcVar3,package._M_dataplus._M_p);
              if (r._M_string_length != 0) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Multiple packages contain a file=");
                std::operator<<(poVar4,pcVar3);
              }
              std::__cxx11::string::_M_assign((string *)&r);
            }
            std::__cxx11::string::~string((string *)&package);
          }
        }
        if (r._M_string_length == 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to find a package for file=");
          std::operator<<(poVar4,pcVar3);
        }
        (*(code *)gflags_exitfunc)(1);
        return;
      }
      if (fLB::FLAGS_helpxml != '\x01') {
        if (fLB::FLAGS_version != '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&substrings);
          return;
        }
        pcVar3 = VersionString();
        pFVar1 = _stdout;
        if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
          pcVar3 = ProgramInvocationShortName();
          fprintf(pFVar1,"%s\n",pcVar3);
        }
        else {
          pcVar5 = ProgramInvocationShortName();
          fprintf(pFVar1,"%s version %s\n",pcVar5,pcVar3);
        }
        fwrite("Debug build (NDEBUG not #defined)\n",0x22,1,_stdout);
        uVar6 = 0;
        goto LAB_0011f45a;
      }
      flags_1.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      flags_1.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      flags_1.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetAllFlags(&flags_1);
      fwrite("<?xml version=\"1.0\"?>\n",0x16,1,_stdout);
      fwrite("<AllFlags>\n",0xb,1,_stdout);
      pFVar1 = _stdout;
      pcVar3 = Basename(pcVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&package,pcVar3,(allocator<char> *)&flags);
      XMLText(&r,&package);
      fprintf(pFVar1,"<program>%s</program>\n",r._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&r);
      std::__cxx11::string::~string((string *)&package);
      pFVar1 = _stdout;
      pcVar3 = ProgramUsage();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&package,pcVar3,(allocator<char> *)&flags);
      XMLText(&r,&package);
      fprintf(pFVar1,"<usage>%s</usage>\n",r._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&r);
      std::__cxx11::string::~string((string *)&package);
      for (pCVar7 = flags_1.
                    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar7 != flags_1.
                    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pCVar7 = pCVar7 + 1) {
        bVar2 = std::operator!=(&pCVar7->description,kStrippedFlagHelp);
        pFVar1 = _stdout;
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&r,"<flag>",(allocator<char> *)&package);
          AddXMLTag(&r,"file",&pCVar7->filename);
          AddXMLTag(&r,"name",&pCVar7->name);
          AddXMLTag(&r,"meaning",&pCVar7->description);
          AddXMLTag(&r,"default",&pCVar7->default_value);
          AddXMLTag(&r,"current",&pCVar7->current_value);
          AddXMLTag(&r,"type",&pCVar7->type);
          std::__cxx11::string::append((char *)&r);
          fprintf(pFVar1,"%s\n",r._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&r);
        }
      }
      fwrite("</AllFlags>\n",0xc,1,_stdout);
      std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
      ~vector(&flags_1);
    }
    else {
      ShowUsageWithFlagsRestrict(pcVar3,(char *)*fLS::FLAGS_helpmatch_abi_cxx11_);
    }
  }
  else {
    ShowUsageWithFlagsRestrict(pcVar3,"");
  }
  uVar6 = 1;
LAB_0011f45a:
  (*(code *)gflags_exitfunc)(uVar6);
  return;
}

Assistant:

void HandleCommandLineHelpFlags() {
  const char* progname = ProgramInvocationShortName();

  HandleCommandLineCompletions();

  vector<string> substrings;
  AppendPrognameStrings(&substrings, progname);

  if (FLAGS_helpshort) {
    // show only flags related to this binary:
    // E.g. for fileutil.cc, want flags containing   ... "/fileutil." cc
    ShowUsageWithFlagsMatching(progname, substrings);
    gflags_exitfunc(1);

  } else if (FLAGS_help || FLAGS_helpfull) {
    // show all options
    ShowUsageWithFlagsRestrict(progname, "");   // empty restrict
    gflags_exitfunc(1);

  } else if (!FLAGS_helpon.empty()) {
    string restrict_ = PATH_SEPARATOR + FLAGS_helpon + ".";
    ShowUsageWithFlagsRestrict(progname, restrict_.c_str());
    gflags_exitfunc(1);

  } else if (!FLAGS_helpmatch.empty()) {
    ShowUsageWithFlagsRestrict(progname, FLAGS_helpmatch.c_str());
    gflags_exitfunc(1);

  } else if (FLAGS_helppackage) {
    // Shows help for all files in the same directory as main().  We
    // don't want to resort to looking at dirname(progname), because
    // the user can pick progname, and it may not relate to the file
    // where main() resides.  So instead, we search the flags for a
    // filename like "/progname.cc", and take the dirname of that.
    vector<CommandLineFlagInfo> flags;
    GetAllFlags(&flags);
    string last_package;
    for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
         flag != flags.end();
         ++flag) {
      if (!FileMatchesSubstring(flag->filename, substrings))
        continue;
      const string package = Dirname(flag->filename) + PATH_SEPARATOR;
      if (package != last_package) {
        ShowUsageWithFlagsRestrict(progname, package.c_str());
        VLOG(7) << "Found package: " << package;
        if (!last_package.empty()) {      // means this isn't our first pkg
          LOG(WARNING) << "Multiple packages contain a file=" << progname;
        }
        last_package = package;
      }
    }
    if (last_package.empty()) {   // never found a package to print
      LOG(WARNING) << "Unable to find a package for file=" << progname;
    }
    gflags_exitfunc(1);

  } else if (FLAGS_helpxml) {
    ShowXMLOfFlags(progname);
    gflags_exitfunc(1);

  } else if (FLAGS_version) {
    ShowVersion();
    // Unlike help, we may be asking for version in a script, so return 0
    gflags_exitfunc(0);

  }
}